

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# private_impl.cpp
# Opt level: O2

void __thiscall raspicam::_private::Private_Impl::Private_Impl(Private_Impl *this)

{
  PORT_USERDATA::PORT_USERDATA(&this->callback_data);
  this->format = (MMAL_ES_FORMAT_T *)0x0;
  this->camera_video_port = (MMAL_PORT_T *)0x0;
  this->_isOpened = false;
  this->_isCapturing = false;
  setDefaultStateParams(this);
  return;
}

Assistant:

Private_Impl::Private_Impl() {
            camera_video_port = NULL;
//             camera_still_port = NULL;
            _isOpened=false;
            _isCapturing=false;
            //set default state params
            setDefaultStateParams();
        }